

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O3

void __thiscall
SplitStringTest_random_vector_Test<wchar_t>::TestBody
          (SplitStringTest_random_vector_Test<wchar_t> *this)

{
  char *pcVar1;
  vector<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
  split_result;
  RandomTestData<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>_> data;
  AssertHelper aAStack_98 [8];
  long *local_90;
  internal local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  container_type_conflict9 local_78;
  RandomTestData<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>_> local_60;
  
  RandomTestData<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>::RandomTestData
            (&local_60,L'\0',0,0);
  jessilib::
  split<std::vector,_std::vector<wchar_t,_std::allocator<wchar_t>_>,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>
            (&local_78,
             (__normal_iterator<const_wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>)
             local_60.m_str.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<const_wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>)
             local_60.m_str.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
             super__Vector_impl_data._M_finish,L'\0');
  testing::internal::
  CmpHelperEQ<std::vector<std::vector<wchar_t,std::allocator<wchar_t>>,std::allocator<std::vector<wchar_t,std::allocator<wchar_t>>>>,std::vector<std::vector<wchar_t,std::allocator<wchar_t>>,std::allocator<std::vector<wchar_t,std::allocator<wchar_t>>>>>
            (local_88,"split_result","data.m_tokens",&local_78,&local_60.m_tokens);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0xef,pcVar1);
    testing::internal::AssertHelper::operator=(aAStack_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(aAStack_98);
    if (local_90 != (long *)0x0) {
      (**(code **)(*local_90 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  std::
  vector<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
  ::~vector(&local_60.m_tokens);
  if (local_60.m_str.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
      super__Vector_impl_data._M_start != (wchar_t *)0x0) {
    operator_delete(local_60.m_str.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.m_str.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.m_str.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.m_delim.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.m_delim.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.m_delim.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.m_delim.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TYPED_TEST(SplitStringTest, random_vector) {
	RandomTestData<TypeParam, std::vector<TypeParam>> data{};
	std::vector<std::vector<TypeParam>> split_result = split<std::vector, std::vector<TypeParam>>(data.m_str, default_delim<TypeParam>);
	EXPECT_EQ(split_result, data.m_tokens);
}